

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void anon_unknown.dwarf_9ee45f::ResolveObjectPlacement
               (aiMatrix4x4 *m,IfcObjectPlacement *place,ConversionData *conv)

{
  IfcLocalPlacement *pIVar1;
  Lazy *this;
  IfcObjectPlacement *place_00;
  aiMatrix4x4 tmp_1;
  aiMatrix4x4t<float> temp;
  IfcMatrix4 tmp;
  undefined1 local_228 [32];
  undefined8 local_208;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [72];
  undefined1 local_1a0 [16];
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  
  pIVar1 = Assimp::STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcLocalPlacement>
                     ((Object *)
                      ((long)&(place->
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                              _vptr_ObjectHelper +
                      (long)(place->
                            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                            _vptr_ObjectHelper[-3]));
  if (pIVar1 == (IfcLocalPlacement *)0x0) {
    Assimp::STEP::Object::GetClassName_abi_cxx11_
              ((string *)local_1e8,
               (Object *)
               ((long)&(place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>)
                       ._vptr_ObjectHelper +
               (long)(place->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObjectPlacement,_0UL>).
                     _vptr_ObjectHelper[-3]));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   "skipping unknown IfcObjectPlacement entity, type is ",(string *)local_1e8);
    Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::__cxx11::string::~string((string *)local_228);
    std::__cxx11::string::~string((string *)local_1e8);
  }
  else {
    local_1a0._0_8_ = 1.0;
    local_1a0._8_8_ = 0.0;
    dStack_190 = 0.0;
    local_188 = 0.0;
    dStack_180 = 0.0;
    local_178 = 1.0;
    local_170 = 0.0;
    dStack_168 = 0.0;
    local_160 = 0.0;
    dStack_158 = 0.0;
    local_150 = 1.0;
    local_148 = 0.0;
    dStack_140 = 0.0;
    local_138 = 0.0;
    dStack_130 = 0.0;
    local_128 = 1.0;
    Assimp::IFC::ConvertAxisPlacement
              ((IfcMatrix4 *)local_1a0,
               *(IfcAxis2Placement **)
                &(pIVar1->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).
                 field_0x20,conv);
    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t((IfcMatrix4 *)local_1a0);
    m->d1 = local_1f8;
    m->d2 = fStack_1f4;
    m->d3 = fStack_1f0;
    m->d4 = fStack_1ec;
    m->c1 = (float)local_208;
    m->c2 = local_208._4_4_;
    m->c3 = fStack_200;
    m->c4 = fStack_1fc;
    m->b1 = (float)local_228._16_4_;
    m->b2 = (float)local_228._20_4_;
    m->b3 = (float)local_228._24_4_;
    m->b4 = (float)local_228._28_4_;
    m->a1 = (float)local_228._0_4_;
    m->a2 = (float)local_228._4_4_;
    m->a3 = (float)local_228._8_4_;
    m->a4 = (float)local_228._12_4_;
    if ((pIVar1->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>).field_0x18 ==
        '\x01') {
      local_228._0_4_ = 1.0;
      local_228._4_4_ = 0.0;
      local_228._8_4_ = 0.0;
      local_228._12_4_ = 0.0;
      local_228._16_4_ = 0.0;
      local_228._20_4_ = 1.0;
      local_228._24_4_ = 0.0;
      local_228._28_4_ = 0.0;
      local_208._0_4_ = 0.0;
      local_208._4_4_ = 0.0;
      fStack_200 = 1.0;
      fStack_1fc = 0.0;
      local_1f8 = 0.0;
      fStack_1f4 = 0.0;
      fStack_1f0 = 0.0;
      fStack_1ec = 1.0;
      this = (Lazy *)Assimp::STEP::
                     Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>::Get
                               ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcObjectPlacement>_>
                                 *)&(pIVar1->
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcLocalPlacement,_2UL>
                                    ).field_0x10);
      place_00 = Assimp::STEP::Lazy::operator_cast_to_IfcObjectPlacement_(this);
      ResolveObjectPlacement((aiMatrix4x4 *)local_228,place_00,conv);
      local_1e8._0_8_ = CONCAT44(local_228._4_4_,local_228._0_4_);
      local_1e8._8_8_ = CONCAT44(local_228._12_4_,local_228._8_4_);
      local_1e8._16_8_ = CONCAT44(local_228._20_4_,local_228._16_4_);
      local_1e8._44_4_ = fStack_1fc;
      local_1e8._40_4_ = fStack_200;
      local_1e8._52_4_ = fStack_1f4;
      local_1e8._48_4_ = local_1f8;
      local_1e8._60_4_ = fStack_1ec;
      local_1e8._56_4_ = fStack_1f0;
      local_1e8._32_4_ = (float)local_208;
      local_1e8._36_4_ = local_208._4_4_;
      local_1e8._24_8_ = local_228._24_8_;
      aiMatrix4x4t<float>::operator*=((aiMatrix4x4t<float> *)local_1e8,m);
      m->a1 = (float)local_1e8._0_4_;
      m->a2 = (float)local_1e8._4_4_;
      m->a3 = (float)local_1e8._8_4_;
      m->a4 = (float)local_1e8._12_4_;
      m->b1 = (float)local_1e8._16_4_;
      m->b2 = (float)local_1e8._20_4_;
      m->b3 = (float)local_1e8._24_4_;
      m->b4 = (float)local_1e8._28_4_;
      m->c1 = (float)local_1e8._32_4_;
      m->c2 = (float)local_1e8._36_4_;
      m->c3 = (float)local_1e8._40_4_;
      m->c4 = (float)local_1e8._44_4_;
      m->d1 = (float)local_1e8._48_4_;
      m->d2 = (float)local_1e8._52_4_;
      m->d3 = (float)local_1e8._56_4_;
      m->d4 = (float)local_1e8._60_4_;
    }
  }
  return;
}

Assistant:

void ResolveObjectPlacement(aiMatrix4x4& m, const Schema_2x3::IfcObjectPlacement& place, ConversionData& conv)
{
    if (const Schema_2x3::IfcLocalPlacement* const local = place.ToPtr<Schema_2x3::IfcLocalPlacement>()){
        IfcMatrix4 tmp;
        ConvertAxisPlacement(tmp, *local->RelativePlacement, conv);

        m = static_cast<aiMatrix4x4>(tmp);

        if (local->PlacementRelTo) {
            aiMatrix4x4 tmp;
            ResolveObjectPlacement(tmp,local->PlacementRelTo.Get(),conv);
            m = tmp * m;
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcObjectPlacement entity, type is " + place.GetClassName());
    }
}